

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib.c
# Opt level: O3

uint dmrC_hexval(uint c)

{
  uint uVar1;
  
  uVar1 = 0x100;
  if (c - 0x30 < 0x37) {
    uVar1 = *(uint *)(&DAT_00137d14 + (ulong)(c - 0x30) * 4);
  }
  return uVar1;
}

Assistant:

unsigned int dmrC_hexval(unsigned int c)
{
	int retval = 256;
	switch (c) {
	case '0':
	case '1':
	case '2':
	case '3':
	case '4':
	case '5':
	case '6':
	case '7':
	case '8':
	case '9':
		retval = c - '0';
		break;
	case 'a':
	case 'b':
	case 'c':
	case 'd':
	case 'e':
	case 'f':
		retval = c - 'a' + 10;
		break;
	case 'A':
	case 'B':
	case 'C':
	case 'D':
	case 'E':
	case 'F':
		retval = c - 'A' + 10;
		break;
	}
	return retval;
}